

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v11::detail::do_format_decimal<char,unsigned__int128>
                 (char *out,unsigned___int128 value,int size)

{
  undefined1 n_00 [16];
  int iVar1;
  undefined2 *puVar2;
  char *pcVar3;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar4 [16];
  uint n;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 uVar5;
  make_unsigned_t<int> local_7c;
  bool local_5d [5];
  undefined1 local_58 [16];
  long local_40;
  ulong local_20;
  undefined2 *local_18;
  size_t local_10;
  undefined2 *local_8;
  
  n_00._8_8_ = in_stack_ffffffffffffff68;
  n_00._0_8_ = in_stack_ffffffffffffff60;
  local_58._0_8_ = in_RSI;
  local_58._8_8_ = in_RDX;
  local_40 = in_RDI;
  iVar1 = count_digits((uint128_opt)n_00);
  local_5d[0] = iVar1 <= in_ECX;
  ignore_unused<bool,char[20]>(local_5d,(char (*) [20])"invalid digit count");
  local_7c = to_unsigned<int>(0);
  auVar4._8_8_ = local_58._8_8_;
  auVar4._0_8_ = local_58._0_8_;
  while (local_58._8_8_ = auVar4._8_8_, local_58._0_8_ = auVar4._0_8_,
        (ulong)((ulong)local_58._0_8_ < 100) <= (ulong)local_58._8_8_) {
    local_7c = local_7c - 2;
    puVar2 = (undefined2 *)(local_40 + (ulong)local_7c);
    uVar5 = 100;
    local_10 = __umodti3(local_58._0_8_,local_58._8_8_);
    local_58 = auVar4;
    local_8 = puVar2;
    pcVar3 = digits2(local_10);
    *puVar2 = *(undefined2 *)pcVar3;
    auVar4 = __udivti3(local_58._0_8_,local_58._8_8_,uVar5,0);
  }
  if ((ulong)local_58._8_8_ < (ulong)((ulong)local_58._0_8_ < 10)) {
    local_58[0] = auVar4[0];
    local_7c = local_7c - 1;
    *(char *)(local_40 + (ulong)local_7c) = local_58[0] + '0';
  }
  else {
    local_7c = local_7c - 2;
    puVar2 = (undefined2 *)(local_40 + (ulong)local_7c);
    local_20 = local_58._0_8_ & 0xffffffff;
    local_18 = puVar2;
    local_58 = auVar4;
    pcVar3 = digits2(local_20);
    *puVar2 = *(undefined2 *)pcVar3;
  }
  return (char *)(local_40 + (ulong)local_7c);
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}